

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::IndirectComputeDispatchTests::init
          (IndirectComputeDispatchTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  deUintptr dVar1;
  deUintptr dVar2;
  undefined8 in_RAX;
  TestNode *node;
  IndirectDispatchCase *pIVar3;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  long lVar5;
  UVec3 *v;
  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
  *pvVar6;
  bool bVar7;
  Vector<unsigned_int,_3> local_6c;
  value_type local_60;
  GenBuffer local_44;
  TestNode *local_40;
  long local_38;
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),init()::s_singleDispatchCases);
  if (init()::s_singleDispatchCases == '\0') {
    uVar4 = __cxa_guard_acquire(&init()::s_singleDispatchCases);
    if ((int)uVar4 != 0) {
      init::s_singleDispatchCases[0].name = "single_invocation";
      init::s_singleDispatchCases[0].description = "Single invocation only from offset 0";
      init::s_singleDispatchCases[0].bufferSize = 0xc;
      init::s_singleDispatchCases[0].offset = 0;
      init::s_singleDispatchCases[0].workGroupSize.m_data[0] = 1;
      init::s_singleDispatchCases[0].workGroupSize.m_data[1] = 1;
      init::s_singleDispatchCases[0].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[0].numWorkGroups.m_data[0] = 1;
      init::s_singleDispatchCases[0].numWorkGroups.m_data[1] = 1;
      init::s_singleDispatchCases[0].numWorkGroups.m_data[2] = 1;
      init::s_singleDispatchCases[1].name = "multiple_groups";
      init::s_singleDispatchCases[1].description = "Multiple groups dispatched from offset 0";
      init::s_singleDispatchCases[1].bufferSize = 0xc;
      init::s_singleDispatchCases[1].offset = 0;
      init::s_singleDispatchCases[1].workGroupSize.m_data[0] = 1;
      init::s_singleDispatchCases[1].workGroupSize.m_data[1] = 1;
      init::s_singleDispatchCases[1].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[1].numWorkGroups.m_data[0] = 2;
      init::s_singleDispatchCases[1].numWorkGroups.m_data[1] = 3;
      init::s_singleDispatchCases[1].numWorkGroups.m_data[2] = 5;
      init::s_singleDispatchCases[2].name = "multiple_groups_multiple_invocations";
      init::s_singleDispatchCases[2].description = "Multiple groups of size 2x3x1 from offset 0";
      init::s_singleDispatchCases[2].bufferSize = 0xc;
      init::s_singleDispatchCases[2].offset = 0;
      init::s_singleDispatchCases[2].workGroupSize.m_data[0] = 2;
      init::s_singleDispatchCases[2].workGroupSize.m_data[1] = 3;
      init::s_singleDispatchCases[2].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[2].numWorkGroups.m_data[0] = 1;
      init::s_singleDispatchCases[2].numWorkGroups.m_data[1] = 2;
      init::s_singleDispatchCases[2].numWorkGroups.m_data[2] = 3;
      init::s_singleDispatchCases[3].name = "small_offset";
      init::s_singleDispatchCases[3].description = "Small offset";
      init::s_singleDispatchCases[3].bufferSize = 0x1c;
      init::s_singleDispatchCases[3].offset = 0x10;
      init::s_singleDispatchCases[3].workGroupSize.m_data[0] = 1;
      init::s_singleDispatchCases[3].workGroupSize.m_data[1] = 1;
      init::s_singleDispatchCases[3].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[3].numWorkGroups.m_data[0] = 1;
      init::s_singleDispatchCases[3].numWorkGroups.m_data[1] = 1;
      init::s_singleDispatchCases[3].numWorkGroups.m_data[2] = 1;
      init::s_singleDispatchCases[4].name = "large_offset";
      init::s_singleDispatchCases[4].description = "Large offset";
      init::s_singleDispatchCases[4].bufferSize = 0x200000;
      init::s_singleDispatchCases[4].offset = 0x10000c;
      init::s_singleDispatchCases[4].workGroupSize.m_data[0] = 1;
      init::s_singleDispatchCases[4].workGroupSize.m_data[1] = 1;
      init::s_singleDispatchCases[4].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[4].numWorkGroups.m_data[0] = 1;
      init::s_singleDispatchCases[4].numWorkGroups.m_data[1] = 1;
      init::s_singleDispatchCases[4].numWorkGroups.m_data[2] = 1;
      init::s_singleDispatchCases[5].name = "large_offset_multiple_invocations";
      init::s_singleDispatchCases[5].description = "Large offset, multiple invocations";
      init::s_singleDispatchCases[5].bufferSize = 0x200000;
      init::s_singleDispatchCases[5].offset = 0x10000c;
      init::s_singleDispatchCases[5].workGroupSize.m_data[0] = 2;
      init::s_singleDispatchCases[5].workGroupSize.m_data[1] = 3;
      init::s_singleDispatchCases[5].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[5].numWorkGroups.m_data[0] = 1;
      init::s_singleDispatchCases[5].numWorkGroups.m_data[1] = 2;
      init::s_singleDispatchCases[5].numWorkGroups.m_data[2] = 3;
      init::s_singleDispatchCases[6].name = "empty_command";
      init::s_singleDispatchCases[6].description = "Empty command";
      init::s_singleDispatchCases[6].bufferSize = 0xc;
      init::s_singleDispatchCases[6].offset = 0;
      init::s_singleDispatchCases[6].workGroupSize.m_data[0] = 1;
      init::s_singleDispatchCases[6].workGroupSize.m_data[1] = 1;
      init::s_singleDispatchCases[6].workGroupSize.m_data[2] = 1;
      init::s_singleDispatchCases[6].numWorkGroups.m_data[0] = 0;
      init::s_singleDispatchCases[6].numWorkGroups.m_data[1] = 0;
      init::s_singleDispatchCases[6].numWorkGroups.m_data[2] = 0;
      uVar4 = __cxa_guard_release(&init()::s_singleDispatchCases);
    }
  }
  lVar5 = 0;
  while (lVar5 != 2) {
    local_44 = init::s_genBuffer[lVar5].gen;
    local_38 = lVar5;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::s_genBuffer[lVar5].name,SSBOArrayLengthTests::init::arraysSized + 1);
    local_40 = node;
    tcu::TestNode::addChild((TestNode *)this,node);
    v = &init::s_singleDispatchCases[0].numWorkGroups;
    lVar5 = 7;
    while( true ) {
      pIVar3 = (IndirectDispatchCase *)operator_new(0xb0);
      context = (this->super_TestCaseGroup).m_context;
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar7) break;
      dVar1 = *(deUintptr *)((long)(v + -3) + 8);
      dVar2 = *(deUintptr *)((long)(v + -2) + 4);
      anon_unknown_1::IndirectDispatchCase::IndirectDispatchCase
                (pIVar3,context,*(char **)((long)(v + -4) + 4),*(char **)(v + -3),local_44);
      (pIVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__IndirectDispatchCase_00a14f48;
      pIVar3->m_bufferSize = dVar1;
      *(undefined8 *)(pIVar3->m_workGroupSize).m_data = *(undefined8 *)v[-1].m_data;
      (pIVar3->m_workGroupSize).m_data[2] = v[-1].m_data[2];
      local_60.offset = dVar2;
      tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,v);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
      ::push_back(&pIVar3->m_commands,&local_60);
      tcu::TestNode::addChild(local_40,(TestNode *)pIVar3);
      v = (UVec3 *)((long)(v + 4) + 8);
    }
    anon_unknown_1::IndirectDispatchCase::IndirectDispatchCase
              (pIVar3,context,"multi_dispatch",
               "Dispatch multiple compute commands from single buffer",local_44);
    (pIVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__IndirectDispatchCase_00a14fe8;
    pIVar3->m_bufferSize = 0x400;
    (pIVar3->m_workGroupSize).m_data[0] = 3;
    (pIVar3->m_workGroupSize).m_data[1] = 1;
    (pIVar3->m_workGroupSize).m_data[2] = 2;
    pvVar6 = &pIVar3->m_commands;
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 1;
    local_60.offset = 0;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 2;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 1;
    local_60.offset = 0xc;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 3;
    local_6c.m_data[2] = 1;
    local_60.offset = 0x68;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 7;
    local_60.offset = 0x28;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 4;
    local_60.offset = 0x34;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    tcu::TestNode::addChild(local_40,(TestNode *)pIVar3);
    pIVar3 = (IndirectDispatchCase *)operator_new(0xb0);
    anon_unknown_1::IndirectDispatchCase::IndirectDispatchCase
              (pIVar3,(this->super_TestCaseGroup).m_context,"multi_dispatch_reuse_command",
               "Dispatch multiple compute commands from single buffer",local_44);
    (pIVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__IndirectDispatchCase_00a15038;
    pIVar3->m_bufferSize = 0x400;
    (pIVar3->m_workGroupSize).m_data[0] = 3;
    (pIVar3->m_workGroupSize).m_data[1] = 1;
    (pIVar3->m_workGroupSize).m_data[2] = 2;
    pvVar6 = &pIVar3->m_commands;
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 1;
    local_60.offset = 0;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 1;
    local_60.offset = 0;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 1;
    local_60.offset = 0;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 3;
    local_6c.m_data[2] = 1;
    local_60.offset = 0x68;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 3;
    local_6c.m_data[2] = 1;
    local_60.offset = 0x68;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 4;
    local_60.offset = 0x34;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    local_6c.m_data[0] = 1;
    local_6c.m_data[1] = 1;
    local_6c.m_data[2] = 4;
    local_60.offset = 0x34;
    tcu::Vector<unsigned_int,_3>::Vector(&local_60.numWorkGroups,&local_6c);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_60);
    tcu::TestNode::addChild(local_40,(TestNode *)pIVar3);
    uVar4 = extraout_RAX;
    lVar5 = local_38 + 1;
  }
  return (int)uVar4;
}

Assistant:

void IndirectComputeDispatchTests::init (void)
{
	static const struct
	{
		const char*		name;
		GenBuffer		gen;
	} s_genBuffer[] =
	{
		{ "upload_buffer",		GEN_BUFFER_UPLOAD	},
		{ "gen_in_compute",		GEN_BUFFER_COMPUTE	}
	};

	static const struct
	{
		const char*	name;
		const char*	description;
		deUintptr	bufferSize;
		deUintptr	offset;
		UVec3		workGroupSize;
		UVec3		numWorkGroups;
	} s_singleDispatchCases[] =
	{
	//	Name										Desc											BufferSize					Offs			WorkGroupSize	NumWorkGroups
		{ "single_invocation",						"Single invocation only from offset 0",			INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "multiple_groups",						"Multiple groups dispatched from offset 0",		INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(2,3,5) },
		{ "multiple_groups_multiple_invocations",	"Multiple groups of size 2x3x1 from offset 0",	INDIRECT_COMMAND_SIZE,		0,				UVec3(2,3,1),	UVec3(1,2,3) },
		{ "small_offset",							"Small offset",									16+INDIRECT_COMMAND_SIZE,	16,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset",							"Large offset",									(2<<20),					(1<<20) + 12,	UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset_multiple_invocations",		"Large offset, multiple invocations",			(2<<20),					(1<<20) + 12,	UVec3(2,3,1),	UVec3(1,2,3) },
		{ "empty_command",							"Empty command",								INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(0,0,0) },
	};

	for (int genNdx = 0; genNdx < DE_LENGTH_OF_ARRAY(s_genBuffer); genNdx++)
	{
		const GenBuffer				genBuf		= s_genBuffer[genNdx].gen;
		tcu::TestCaseGroup* const	genGroup	= new tcu::TestCaseGroup(m_testCtx, s_genBuffer[genNdx].name, "");
		addChild(genGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_singleDispatchCases); ndx++)
			genGroup->addChild(new SingleDispatchCase(m_context,
													  s_singleDispatchCases[ndx].name,
													  s_singleDispatchCases[ndx].description,
													  genBuf,
													  s_singleDispatchCases[ndx].bufferSize,
													  s_singleDispatchCases[ndx].offset,
													  s_singleDispatchCases[ndx].workGroupSize,
													  s_singleDispatchCases[ndx].numWorkGroups));

		genGroup->addChild(new MultiDispatchCase				(m_context, genBuf));
		genGroup->addChild(new MultiDispatchReuseCommandCase	(m_context, genBuf));
	}
}